

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledLineOrder.cpp
# Opt level: O0

void testTiledLineOrder(string *tempDir)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  void *this;
  undefined8 in_RDI;
  string *unaff_retaddr;
  exception *e;
  int n;
  int maxThreads;
  int YS;
  int XS;
  int H;
  int W;
  int local_2c;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Testing line orders for tiled files and buffered/unbuffered tile writes"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  bVar1 = IlmThread_3_2::supportsThreads();
  iVar2 = 0;
  if ((bVar1 & 1) != 0) {
    iVar2 = 3;
  }
  for (local_2c = 0; local_2c <= iVar2; local_2c = local_2c + 1) {
    bVar1 = IlmThread_3_2::supportsThreads();
    if ((bVar1 & 1) != 0) {
      Imf_3_2::setGlobalThreadCount(local_2c);
      poVar4 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      iVar3 = Imf_3_2::globalThreadCount();
      this = (void *)std::ostream::operator<<(poVar4,iVar3);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    anon_unknown.dwarf_228b70::writeCopyRead
              (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffff4,
               in_stack_fffffffffffffff0);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testTiledLineOrder (const std::string& tempDir)
{
    try
    {
        cout << "Testing line orders for tiled files and "
                "buffered/unbuffered tile writes"
             << endl;

        const int W  = 171;
        const int H  = 259;
        const int XS = 55;
        const int YS = 55;

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            writeCopyRead (tempDir, W, H, XS, YS);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}